

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O2

int __thiscall Fl_Function_Type::open(Fl_Function_Type *this,char *__file,int __oflag,...)

{
  char cVar1;
  Fl_Menu_Item *pFVar2;
  char *__s2;
  bool bVar3;
  Fl_Window *pFVar4;
  int iVar5;
  Fl_Class_Type *pFVar6;
  Fl_Button *pFVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  Fl_Double_Window *__stat_loc;
  Fl_Double_Window *pFVar12;
  Fl_Choice **ppFVar13;
  Fl_Choice **ppFVar14;
  Fl_Double_Window *pFVar15;
  
  if (function_panel == (Fl_Double_Window *)0x0) {
    make_function_panel();
  }
  Fl_Input_::static_value(&f_return_type_input->super_Fl_Input_,this->return_type);
  Fl_Input_::static_value(&f_name_input->super_Fl_Input_,(this->super_Fl_Type).name_);
  pFVar6 = Fl_Type::is_in_class(&this->super_Fl_Type);
  if (pFVar6 == (Fl_Class_Type *)0x0) {
    ppFVar13 = &f_public_choice;
    Fl_Choice::value(f_public_choice,(uint)('\0' < this->public_));
    ppFVar14 = &f_public_member_choice;
  }
  else {
    ppFVar13 = &f_public_member_choice;
    Fl_Choice::value(f_public_member_choice,(int)this->public_);
    ppFVar14 = &f_public_choice;
  }
  (*((*ppFVar13)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
  (*((*ppFVar14)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  Fl_Button::value(&f_c_button->super_Fl_Button,(int)this->cdecl_);
  pcVar8 = (this->super_Fl_Type).comment_;
  pcVar11 = "";
  if (pcVar8 != (char *)0x0) {
    pcVar11 = pcVar8;
  }
  Fl_Text_Buffer::text((f_comment_input->super_Fl_Text_Display).mBuffer,pcVar11);
  __stat_loc = function_panel;
  (*(function_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  pcVar8 = (char *)0x0;
  do {
    do {
      do {
        if (pcVar8 != (char *)0x0) {
          __stat_loc = (Fl_Double_Window *)0x21102d;
          fl_alert("%s");
        }
        while( true ) {
          pFVar7 = (Fl_Button *)Fl::readqueue();
          if (pFVar7 == f_panel_cancel) goto LAB_0017a659;
          if (pFVar7 == &f_panel_ok->super_Fl_Button) break;
          if (pFVar7 == (Fl_Button *)0x0) {
            Fl::wait(__stat_loc);
          }
        }
        pFVar12 = (Fl_Double_Window *)((f_name_input->super_Fl_Input_).value_ + -1);
        do {
          pFVar4 = &pFVar12->super_Fl_Window;
          pFVar12 = (Fl_Double_Window *)
                    ((long)&(pFVar12->super_Fl_Window).super_Fl_Group.super_Fl_Widget.
                            _vptr_Fl_Widget + 1);
          iVar5 = isspace((int)*(char *)((long)&(pFVar4->super_Fl_Group).super_Fl_Widget.
                                                _vptr_Fl_Widget + 1));
        } while (iVar5 != 0);
        __stat_loc = pFVar12;
        pcVar8 = c_check((char *)pFVar12,0);
        pFVar15 = pFVar12;
      } while (pcVar8 != (char *)0x0);
      do {
        cVar1 = *(char *)&(pFVar15->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget;
        uVar10 = (uint)cVar1;
        if (uVar10 == 0x28) goto LAB_0017a518;
        __stat_loc = (Fl_Double_Window *)(ulong)uVar10;
        iVar5 = isspace(uVar10);
      } while ((cVar1 != '\0') &&
              (pFVar15 = (Fl_Double_Window *)
                         ((long)&(pFVar15->super_Fl_Window).super_Fl_Group.super_Fl_Widget.
                                 _vptr_Fl_Widget + 1), iVar5 == 0));
      pcVar8 = "must be name(arguments), try again:";
    } while (*(char *)&(pFVar12->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget !=
             '\0');
LAB_0017a518:
    pFVar12 = (Fl_Double_Window *)(f_return_type_input->super_Fl_Input_).value_;
    __stat_loc = pFVar12;
    pcVar8 = c_check((char *)pFVar12,0);
  } while (pcVar8 != (char *)0x0);
  Fl_Type::name(&this->super_Fl_Type,(f_name_input->super_Fl_Input_).value_);
  storestring((char *)pFVar12,&this->return_type,0);
  pFVar6 = Fl_Type::is_in_class(&this->super_Fl_Type);
  if (pFVar6 == (Fl_Class_Type *)0x0) {
    ppFVar13 = &f_public_choice;
  }
  else {
    ppFVar13 = &f_public_member_choice;
  }
  pFVar2 = ((*ppFVar13)->super_Fl_Menu_).value_;
  if (pFVar2 == (Fl_Menu_Item *)0x0) {
    lVar9 = 0xff;
    if (this->public_ == -1) {
      bVar3 = false;
      goto LAB_0017a5d2;
    }
  }
  else {
    lVar9 = ((long)pFVar2 - (long)((*ppFVar13)->super_Fl_Menu_).menu_) / 0x38;
    if ((int)lVar9 == (int)this->public_) {
      bVar3 = false;
      goto LAB_0017a5d2;
    }
  }
  bVar3 = true;
  this->public_ = (char)lVar9;
  redraw_browser();
LAB_0017a5d2:
  cVar1 = (f_c_button->super_Fl_Button).value_;
  if (this->cdecl_ != cVar1) {
    this->cdecl_ = cVar1;
    bVar3 = true;
  }
  pcVar8 = Fl_Text_Buffer::text((f_comment_input->super_Fl_Text_Display).mBuffer);
  if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
    if ((this->super_Fl_Type).comment_ != (char *)0x0) {
      redraw_browser();
    }
    pcVar11 = (char *)0x0;
  }
  else {
    __s2 = (this->super_Fl_Type).comment_;
    pcVar11 = pcVar8;
    if ((__s2 == (char *)0x0) || (iVar5 = strcmp(pcVar8,__s2), iVar5 != 0)) {
      redraw_browser();
    }
  }
  Fl_Type::comment(&this->super_Fl_Type,pcVar11);
  free(pcVar8);
  if (bVar3) {
    set_modflag(1);
  }
LAB_0017a659:
  iVar5 = (*(function_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return iVar5;
}

Assistant:

void Fl_Function_Type::open() {
  if (!function_panel) make_function_panel();
  f_return_type_input->static_value(return_type);
  f_name_input->static_value(name());
  if (is_in_class()) {
    f_public_member_choice->value(public_);
    f_public_member_choice->show();
    f_public_choice->hide();
  } else {
    f_public_choice->value(public_>0);
    f_public_choice->show();
    f_public_member_choice->hide();
  }
  f_c_button->value(cdecl_);
  const char *c = comment();
  f_comment_input->buffer()->text(c?c:"");
  function_panel->show();
  const char* message = 0;
  for (;;) { // repeat as long as there are errors
    if (message) fl_alert("%s", message);
    for (;;) {
      Fl_Widget* w = Fl::readqueue();
      if (w == f_panel_cancel) goto BREAK2;
      else if (w == f_panel_ok) break;
      else if (!w) Fl::wait();
    }
    const char*c = f_name_input->value();
    while (isspace(*c)) c++;
    message = c_check(c); if (message) continue;
    const char *d = c;
    for (; *d != '('; d++) if (isspace(*d) || !*d) break;
    if (*c && *d != '(') {
      message = "must be name(arguments), try again:"; continue;
    }
    int mod = 0;
    c = f_return_type_input->value();
    message = c_check(c); if (message) continue;
    name(f_name_input->value());
    storestring(c, return_type);
    if (is_in_class()) {
      if (public_ != f_public_member_choice->value()) {
        mod = 1;
        public_ = f_public_member_choice->value();
        redraw_browser();
      }
    } else {
      if (public_ != f_public_choice->value()) {
        mod = 1;
        public_ = f_public_choice->value();
        redraw_browser();
      }
    }
    if (cdecl_ != f_c_button->value()) {
      mod = 1;
      cdecl_ = f_c_button->value();
    }
    c = f_comment_input->buffer()->text();
    if (c && *c) {
      if (!comment() || strcmp(c, comment())) redraw_browser();
      comment(c);
    } else {
      if (comment()) redraw_browser();
      comment(0);
    }
    if (c) free((void*)c);
    if (mod) set_modflag(1);
    break;
  }
BREAK2:
  function_panel->hide();
}